

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

xmlChar * xmlDecodeEntities(xmlParserCtxtPtr ctxt,int len,int what,xmlChar end,xmlChar end2,
                           xmlChar end3)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar end3_local;
  xmlChar end2_local;
  xmlChar end_local;
  int what_local;
  int len_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (xmlDecodeEntities::deprecated == 0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"xmlDecodeEntities() deprecated function reached\n");
    xmlDecodeEntities::deprecated = 1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlDecodeEntities(xmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                  int len ATTRIBUTE_UNUSED, int what ATTRIBUTE_UNUSED,
                  xmlChar end ATTRIBUTE_UNUSED,
                  xmlChar end2 ATTRIBUTE_UNUSED,
                  xmlChar end3 ATTRIBUTE_UNUSED)
{
    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "xmlDecodeEntities() deprecated function reached\n");
        deprecated = 1;
    }
    return (NULL);
}